

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCommit(Btree *p)

{
  undefined4 local_14;
  int rc;
  Btree *p_local;
  
  sqlite3BtreeEnter(p);
  local_14 = sqlite3BtreeCommitPhaseOne(p,(char *)0x0);
  if (local_14 == 0) {
    local_14 = sqlite3BtreeCommitPhaseTwo(p,0);
  }
  sqlite3BtreeLeave(p);
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommit(Btree *p){
  int rc;
  sqlite3BtreeEnter(p);
  rc = sqlite3BtreeCommitPhaseOne(p, 0);
  if( rc==SQLITE_OK ){
    rc = sqlite3BtreeCommitPhaseTwo(p, 0);
  }
  sqlite3BtreeLeave(p);
  return rc;
}